

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O2

string * __thiscall
ninx::parser::element::Block::__render_output_abi_cxx11_(string *__return_storage_ptr__,Block *this)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *segment;
  pointer pbVar2;
  stringstream output;
  char *local_1d0;
  size_type local_1c8;
  char local_1c0;
  undefined7 uStack_1bf;
  undefined8 uStack_1b8;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  pbVar1 = (this->__output_segments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (this->__output_segments).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    std::operator<<(local_1a0,(string *)pbVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->__output_segments);
  std::__cxx11::stringbuf::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_1d0 == &local_1c0) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1bf,local_1c0);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1b8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1d0;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1bf,local_1c0);
  }
  __return_storage_ptr__->_M_string_length = local_1c8;
  local_1c8 = 0;
  local_1c0 = '\0';
  local_1d0 = &local_1c0;
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::Block::__render_output() {
    std::stringstream output;
    for (auto &segment : __output_segments) {
        output << segment;
    }
    __output_segments.clear();
    return std::move(output.str());
}